

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O3

double __thiscall
double_conversion::StringToDoubleConverter::StringToIeee<char_const*>
          (StringToDoubleConverter *this,char *input,int length,bool read_as_double,
          int *processed_characters_count)

{
  uc16 separator;
  uint uVar1;
  long lVar2;
  char *pcVar3;
  char cVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  byte *pbVar9;
  locale *plVar10;
  byte bVar11;
  byte bVar12;
  int iVar13;
  byte *pbVar14;
  char cVar15;
  int iVar16;
  byte *pbVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  byte bVar22;
  int iVar23;
  uint uVar24;
  long in_FS_OFFSET;
  bool sign;
  float fVar25;
  double dVar26;
  Vector<const_char> trimmed;
  Vector<const_char> trimmed_00;
  bool *in_stack_fffffffffffffc50;
  int local_378;
  char *start;
  undefined1 local_359;
  char *end;
  undefined8 local_350;
  char buffer [782];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  end = input + length;
  *processed_characters_count = 0;
  local_350 = (byte *)input;
  if (length != 0) {
    uVar1 = this->flags_;
    if ((uVar1 & 0x18) == 0) {
      bVar5 = *input;
LAB_003dff64:
      if ((bVar5 == 0x2d) || (bVar5 == 0x2b)) {
        sign = bVar5 == 0x2d;
        pbVar17 = local_350 + 1;
        if (pbVar17 != (byte *)end) {
          lVar20 = 1;
          do {
            lVar21 = 0;
            while ((&kWhitespaceTable7)[lVar21] != local_350[lVar20]) {
              lVar21 = lVar21 + 1;
              if (lVar21 == 6) {
                if (lVar20 != 1 && (char)((uVar1 & 0x20) >> 5) == '\0') goto LAB_003e0526;
                local_350 = local_350 + lVar20;
                goto LAB_003dfffb;
              }
            }
            lVar21 = lVar20 + 1;
            lVar20 = lVar20 + 1;
          } while (local_350 + lVar21 != (byte *)end);
        }
        goto LAB_003e0526;
      }
      sign = false;
LAB_003dfffb:
      pbVar17 = (byte *)this->infinity_symbol_;
      iVar23 = (int)input;
      cVar4 = (char)((uVar1 & 0x10) >> 4);
      if (pbVar17 == (byte *)0x0) {
        pbVar17 = (byte *)this->nan_symbol_;
        if (pbVar17 != (byte *)0x0) {
          bVar5 = *local_350;
          if ((uVar1 & 0x40) == 0) {
LAB_003e00d6:
            if (*pbVar17 == bVar5) goto LAB_003e0130;
          }
          else {
LAB_003e00fd:
            if (((anonymous_namespace)::ToLower(char)::cType == '\0') &&
               (iVar18 = __cxa_guard_acquire(&(anonymous_namespace)::ToLower(char)::cType),
               iVar18 != 0)) {
              plVar10 = (locale *)std::locale::classic();
              (anonymous_namespace)::ToLower(char)::cType =
                   std::use_facet<std::ctype<char>>(plVar10);
              __cxa_guard_release(&(anonymous_namespace)::ToLower(char)::cType);
            }
            in_stack_fffffffffffffc50 = (bool *)0x3e011b;
            bVar5 = (**(code **)(*(long *)(anonymous_namespace)::ToLower(char)::cType + 0x20))
                              ((anonymous_namespace)::ToLower(char)::cType,(int)(char)bVar5);
            if (bVar5 == *pbVar17) {
              pbVar17 = (byte *)this->nan_symbol_;
LAB_003e0130:
              pcVar3 = end;
              bVar6 = (anonymous_namespace)::ConsumeSubString<char_const*>
                                ((char **)&local_350,end,(char *)pbVar17,
                                 SUB41((uVar1 & 0x40) >> 6,0));
              pbVar17 = local_350;
              if (bVar6) {
                cVar15 = (char)((uVar1 & 4) >> 2);
                if (cVar4 == '\0' && cVar15 == '\0') {
                  pbVar14 = (byte *)pcVar3;
                  if (local_350 != (byte *)pcVar3) goto LAB_003e0526;
                }
                else {
                  pbVar9 = local_350;
                  pbVar14 = local_350;
                  if (cVar15 == '\0' && local_350 != (byte *)pcVar3) {
                    do {
                      lVar20 = 0;
                      while ((&kWhitespaceTable7)[lVar20] != *pbVar9) {
                        lVar20 = lVar20 + 1;
                        if (lVar20 == 6) goto LAB_003e0526;
                      }
                      pbVar9 = pbVar9 + 1;
                      pbVar14 = (byte *)pcVar3;
                    } while (pbVar9 != (byte *)pcVar3);
                  }
                }
                *processed_characters_count = (int)pbVar14 - iVar23;
                if (sign == false) {
                  dVar26 = NAN;
                }
                else {
                  dVar26 = -NAN;
                }
                goto LAB_003e052c;
              }
              goto LAB_003e0526;
            }
          }
        }
LAB_003e0185:
        bVar5 = *local_350;
        uVar24 = 0;
        separator = this->separator_;
        bVar22 = 0;
        if (bVar5 != 0x30) {
LAB_003e01aa:
          bVar6 = false;
          local_378 = 0;
          iVar18 = 0;
          do {
            bVar11 = *local_350;
            if (9 < (byte)(bVar11 - 0x30)) {
              bVar12 = bVar22;
              if (iVar18 == 0) {
                bVar12 = 0;
              }
              iVar16 = 0;
              if (bVar11 != 0x2e) goto LAB_003e04bc;
              if (((~bVar12 | (byte)uVar1 >> 2) & 1) == 0) goto LAB_003e0806;
              iVar16 = 0;
              pbVar17 = local_350;
              if ((bVar12 & 1) != 0) goto LAB_003e0233;
              in_stack_fffffffffffffc50 = (bool *)0x3e0630;
              bVar7 = Advance<char_const*>((char **)&local_350,separator,10,&end);
              if (bVar7) {
                iVar16 = 0;
                pbVar17 = local_350;
                bVar12 = bVar22;
                if (iVar18 != 0) goto LAB_003e0233;
                if (bVar5 != 0x30) goto LAB_003e0806;
                goto LAB_003e044e;
              }
              iVar16 = 0;
              if ((iVar18 != 0) || (*local_350 != 0x30)) goto LAB_003e06f4;
              iVar16 = 0;
              goto LAB_003e06c9;
            }
            if (iVar18 < 0x304) {
              lVar20 = (long)(int)uVar24;
              uVar24 = uVar24 + 1;
              buffer[lVar20] = bVar11;
              iVar18 = iVar18 + 1;
            }
            else {
              local_378 = local_378 + 1;
              bVar6 = (bool)(bVar11 != 0x30 | bVar6);
            }
            bVar22 = bVar22 & bVar11 < 0x38;
            in_stack_fffffffffffffc50 = (bool *)0x3e0228;
            bVar7 = Advance<char_const*>((char **)&local_350,separator,10,&end);
          } while (!bVar7);
          iVar16 = 0;
          pbVar17 = local_350;
          bVar12 = bVar22;
          goto LAB_003e0233;
        }
        in_stack_fffffffffffffc50 = (bool *)0x3e02b3;
        bVar6 = Advance<char_const*>((char **)&local_350,separator,10,&end);
        pcVar3 = end;
        if (!bVar6) {
          bVar22 = (byte)this->flags_;
          if (((this->flags_ & 0x81U) != 0) && ((*local_350 | 0x20) == 0x78)) {
            pbVar17 = local_350 + 1;
            local_350 = pbVar17;
            if (pbVar17 == (byte *)end) goto LAB_003e0806;
            if ((char)bVar22 < '\0') {
              bVar6 = IsHexFloatString<char_const*>
                                ((char *)pbVar17,end,separator,SUB41((uVar1 & 4) >> 2,0));
              bVar7 = true;
              if (!bVar6) goto LAB_003e0385;
            }
            else {
LAB_003e0385:
              bVar5 = *pbVar17;
              if ((0x3f < (char)bVar5 || 9 < (int)(char)bVar5 - 0x30U) &&
                 ((pbVar17 = local_350, 0x25 < (byte)(bVar5 + 0xbf) ||
                  ((0x3f0000003fU >> ((ulong)(byte)(bVar5 + 0xbf) & 0x3f) & 1) == 0))))
              goto LAB_003e0526;
              bVar7 = false;
            }
            buffer[0] = -0x56;
            dVar26 = RadixStringToIeee<4,char_const*>
                               ((char **)&local_350,pcVar3,sign,separator,bVar7,
                                SUB41((uVar1 & 4) >> 2,0),this->junk_string_value_,read_as_double,
                                (bool *)buffer);
            if (buffer[0] == '\0') {
              pbVar17 = local_350;
              pbVar14 = local_350;
              if (local_350 != (byte *)pcVar3 && (uVar1 & 0x10) != 0) {
                do {
                  lVar20 = 0;
                  while ((&kWhitespaceTable7)[lVar20] != *pbVar14) {
                    lVar20 = lVar20 + 1;
                    pbVar17 = pbVar14;
                    if (lVar20 == 6) goto LAB_003e0405;
                  }
                  pbVar14 = pbVar14 + 1;
                  pbVar17 = (byte *)pcVar3;
                } while (pbVar14 != (byte *)pcVar3);
              }
LAB_003e0405:
              *processed_characters_count = (int)pbVar17 - iVar23;
            }
            goto LAB_003e052c;
          }
          do {
            if (*local_350 != 0x30) {
              bVar22 = bVar22 >> 1;
              goto LAB_003e01aa;
            }
            in_stack_fffffffffffffc50 = (bool *)0x3e0427;
            bVar6 = Advance<char_const*>((char **)&local_350,separator,10,&end);
          } while (!bVar6);
        }
        *processed_characters_count = (int)local_350 - iVar23;
joined_r0x003e02c5:
        if (sign == false) {
          dVar26 = 0.0;
        }
        else {
          dVar26 = -0.0;
        }
      }
      else {
        bVar5 = *local_350;
        if ((uVar1 & 0x40) == 0) {
          if (*pbVar17 == bVar5) goto LAB_003e0075;
          pbVar17 = (byte *)this->nan_symbol_;
          if (pbVar17 != (byte *)0x0) goto LAB_003e00d6;
          goto LAB_003e0185;
        }
        if (((anonymous_namespace)::ToLower(char)::cType == '\0') &&
           (iVar18 = __cxa_guard_acquire(&(anonymous_namespace)::ToLower(char)::cType), iVar18 != 0)
           ) {
          plVar10 = (locale *)std::locale::classic();
          (anonymous_namespace)::ToLower(char)::cType = std::use_facet<std::ctype<char>>(plVar10);
          __cxa_guard_release(&(anonymous_namespace)::ToLower(char)::cType);
        }
        in_stack_fffffffffffffc50 = (bool *)0x3e003b;
        bVar5 = (**(code **)(*(long *)(anonymous_namespace)::ToLower(char)::cType + 0x20))
                          ((anonymous_namespace)::ToLower(char)::cType,(int)(char)bVar5);
        if (bVar5 != *pbVar17) {
          pbVar17 = (byte *)this->nan_symbol_;
          if (pbVar17 != (byte *)0x0) {
            bVar5 = *local_350;
            goto LAB_003e00fd;
          }
          goto LAB_003e0185;
        }
        pbVar17 = (byte *)this->infinity_symbol_;
LAB_003e0075:
        pcVar3 = end;
        bVar6 = (anonymous_namespace)::ConsumeSubString<char_const*>
                          ((char **)&local_350,end,(char *)pbVar17,SUB41((uVar1 & 0x40) >> 6,0));
        pbVar17 = local_350;
        if (bVar6) {
          cVar15 = (char)((uVar1 & 4) >> 2);
          if (cVar4 == '\0' && cVar15 == '\0') {
            pbVar14 = (byte *)pcVar3;
            if (local_350 != (byte *)pcVar3) goto LAB_003e0526;
          }
          else {
            pbVar9 = local_350;
            pbVar14 = local_350;
            if (cVar15 == '\0' && local_350 != (byte *)pcVar3) {
              do {
                lVar20 = 0;
                while ((&kWhitespaceTable7)[lVar20] != *pbVar9) {
                  lVar20 = lVar20 + 1;
                  if (lVar20 == 6) goto LAB_003e0526;
                }
                pbVar9 = pbVar9 + 1;
                pbVar14 = (byte *)pcVar3;
              } while (pbVar9 != (byte *)pcVar3);
            }
          }
          *processed_characters_count = (int)pbVar14 - iVar23;
          if (sign == false) {
            dVar26 = INFINITY;
          }
          else {
            dVar26 = -INFINITY;
          }
          goto LAB_003e052c;
        }
LAB_003e0526:
        local_350 = pbVar17;
        dVar26 = this->junk_string_value_;
      }
      goto LAB_003e052c;
    }
    do {
      bVar5 = *local_350;
      lVar20 = 0;
      while ((&kWhitespaceTable7)[lVar20] != bVar5) {
        lVar20 = lVar20 + 1;
        if (lVar20 == 6) {
          pbVar17 = local_350;
          if (local_350 == (byte *)input || (char)((uVar1 & 8) >> 3) != '\0') goto LAB_003dff64;
          goto LAB_003e0526;
        }
      }
      local_350 = local_350 + 1;
    } while (local_350 != (byte *)end);
    *processed_characters_count = length;
  }
  dVar26 = this->empty_string_value_;
  local_350 = (byte *)input;
  goto LAB_003e052c;
  while (iVar16 = iVar16 + -1, *local_350 == 0x30) {
LAB_003e06c9:
    in_stack_fffffffffffffc50 = (bool *)0x3e06e0;
    bVar7 = Advance<char_const*>((char **)&local_350,separator,10,&end);
    if (bVar7) {
      *processed_characters_count = (int)local_350 - iVar23;
      goto joined_r0x003e02c5;
    }
  }
LAB_003e06f4:
  do {
    bVar11 = *local_350;
    if (9 < (byte)(bVar11 - 0x30)) goto LAB_003e04bc;
    if (iVar18 < 0x304) {
      lVar20 = (long)(int)uVar24;
      uVar24 = uVar24 + 1;
      buffer[lVar20] = bVar11;
      iVar18 = iVar18 + 1;
      iVar16 = iVar16 + -1;
    }
    else {
      bVar6 = (bool)(bVar11 != 0x30 | bVar6);
    }
    in_stack_fffffffffffffc50 = (bool *)0x3e074d;
    bVar7 = Advance<char_const*>((char **)&local_350,separator,10,&end);
    pbVar17 = local_350;
  } while (!bVar7);
  goto LAB_003e0233;
LAB_003e04bc:
  pbVar17 = local_350;
  if ((iVar18 == 0 && iVar16 == 0) && bVar5 != 0x30) {
LAB_003e0806:
    dVar26 = this->junk_string_value_;
    goto LAB_003e052c;
  }
  if ((bVar11 | 0x20) == 0x65) {
    if (((~bVar12 | (byte)uVar1 >> 2) & 1) == 0) goto LAB_003e0806;
    if ((bVar12 & 1) == 0) {
      pbVar14 = local_350 + 1;
      if ((pbVar14 != (byte *)end) &&
         ((((bVar5 = *pbVar14, bVar5 != 0x2d && (bVar22 = 0x2b, bVar5 != 0x2b)) ||
           (pbVar14 = local_350 + 2, bVar22 = bVar5, pbVar14 != (byte *)end)) &&
          ((pbVar14 != (byte *)end && (bVar5 = *pbVar14, 0xf5 < (byte)(bVar5 - 0x3a))))))) {
        iVar18 = 0;
        do {
          pbVar14 = pbVar14 + 1;
          if ((iVar18 < 0x6666666) || ((iVar13 = 0x3fffffff, iVar18 == 0x6666666 && (bVar5 < 0x34)))
             ) {
            iVar13 = (uint)bVar5 + iVar18 * 10 + -0x30;
          }
          iVar18 = iVar13;
          local_350 = (byte *)end;
        } while ((pbVar14 != (byte *)end) &&
                (bVar5 = *pbVar14, local_350 = pbVar14, (byte)(bVar5 - 0x30) < 10));
        iVar13 = -iVar18;
        if (bVar22 != 0x2d) {
          iVar13 = iVar18;
        }
        iVar16 = iVar16 + iVar13;
        goto LAB_003e0661;
      }
      local_350 = pbVar14;
      if ((uVar1 & 4) == 0) goto LAB_003e0806;
    }
  }
  else {
LAB_003e0661:
    pbVar14 = local_350;
    pbVar17 = local_350;
    if (cVar4 == '\0' && (char)((uVar1 & 4) >> 2) == '\0') {
      pbVar9 = local_350;
      if (local_350 != (byte *)end) goto LAB_003e0806;
joined_r0x003e076f:
      for (; pbVar17 != pbVar9; pbVar17 = pbVar17 + 1) {
        lVar20 = 0;
        while ((&kWhitespaceTable7)[lVar20] != *pbVar17) {
          lVar20 = lVar20 + 1;
          if (lVar20 == 6) goto LAB_003e0806;
        }
        pbVar14 = pbVar9;
      }
    }
    else {
      pbVar9 = (byte *)end;
      if ((uVar1 & 4) == 0) goto joined_r0x003e076f;
    }
    local_350 = pbVar14;
    pbVar17 = local_350;
    if (((uVar1 & 0x10) != 0) && (local_350 != (byte *)end)) {
      do {
        lVar20 = 0;
        while ((&kWhitespaceTable7)[lVar20] != *local_350) {
          lVar20 = lVar20 + 1;
          pbVar17 = local_350;
          if (lVar20 == 6) goto LAB_003e0233;
        }
        local_350 = local_350 + 1;
      } while (local_350 != (byte *)end);
      local_350 = (byte *)end;
      pbVar17 = local_350;
    }
  }
LAB_003e0233:
  local_350 = pbVar17;
  if ((bVar12 & 1) == 0) {
    local_378 = local_378 + iVar16;
LAB_003e044e:
    if (bVar6) {
      lVar20 = (long)(int)uVar24;
      uVar24 = uVar24 + 1;
      buffer[lVar20] = '1';
      local_378 = local_378 + -1;
    }
    buffer[(int)uVar24] = '\0';
    uVar8 = (ulong)uVar24;
    uVar19 = (ulong)(uVar24 + 1);
    do {
      if ((int)uVar8 < 1) {
        uVar19 = 0;
        break;
      }
      uVar19 = (ulong)((int)uVar19 - 1);
      lVar20 = uVar8 - 1;
      uVar8 = uVar8 - 1;
    } while (buffer[lVar20] == '0');
    local_378 = (uVar24 - (int)uVar19) + local_378;
    if (read_as_double) {
      trimmed._8_8_ = uVar19;
      trimmed.start_ = buffer;
      dVar26 = StrtodTrimmed(trimmed,local_378);
    }
    else {
      trimmed_00._8_8_ = uVar19;
      trimmed_00.start_ = buffer;
      fVar25 = StrtofTrimmed(trimmed_00,local_378);
      dVar26 = (double)fVar25;
    }
    *processed_characters_count = (int)local_350 - iVar23;
    if (sign != false) {
      dVar26 = -dVar26;
    }
  }
  else {
    start = buffer;
    dVar26 = RadixStringToIeee<3,char*>
                       (&start,buffer + (int)uVar24,sign,separator,SUB41((uVar1 & 4) >> 2,0),
                        read_as_double,this->junk_string_value_,SUB81(&local_359,0),
                        in_stack_fffffffffffffc50);
    *processed_characters_count = (int)local_350 - iVar23;
  }
LAB_003e052c:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return dVar26;
  }
  __stack_chk_fail();
}

Assistant:

double StringToDoubleConverter::StringToIeee(
    Iterator input,
    int length,
    bool read_as_double,
    int* processed_characters_count) const {
  Iterator current = input;
  Iterator end = input + length;

  *processed_characters_count = 0;

  const bool allow_trailing_junk = (flags_ & ALLOW_TRAILING_JUNK) != 0;
  const bool allow_leading_spaces = (flags_ & ALLOW_LEADING_SPACES) != 0;
  const bool allow_trailing_spaces = (flags_ & ALLOW_TRAILING_SPACES) != 0;
  const bool allow_spaces_after_sign = (flags_ & ALLOW_SPACES_AFTER_SIGN) != 0;
  const bool allow_case_insensitivity = (flags_ & ALLOW_CASE_INSENSITIVITY) != 0;

  // To make sure that iterator dereferencing is valid the following
  // convention is used:
  // 1. Each '++current' statement is followed by check for equality to 'end'.
  // 2. If AdvanceToNonspace returned false then current == end.
  // 3. If 'current' becomes equal to 'end' the function returns or goes to
  // 'parsing_done'.
  // 4. 'current' is not dereferenced after the 'parsing_done' label.
  // 5. Code before 'parsing_done' may rely on 'current != end'.
  if (current == end) return empty_string_value_;

  if (allow_leading_spaces || allow_trailing_spaces) {
    if (!AdvanceToNonspace(&current, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return empty_string_value_;
    }
    if (!allow_leading_spaces && (input != current)) {
      // No leading spaces allowed, but AdvanceToNonspace moved forward.
      return junk_string_value_;
    }
  }

  // Exponent will be adjusted if insignificant digits of the integer part
  // or insignificant leading zeros of the fractional part are dropped.
  int exponent = 0;
  int significant_digits = 0;
  int insignificant_digits = 0;
  bool nonzero_digit_dropped = false;

  bool sign = false;

  if (*current == '+' || *current == '-') {
    sign = (*current == '-');
    ++current;
    Iterator next_non_space = current;
    // Skip following spaces (if allowed).
    if (!AdvanceToNonspace(&next_non_space, end)) return junk_string_value_;
    if (!allow_spaces_after_sign && (current != next_non_space)) {
      return junk_string_value_;
    }
    current = next_non_space;
  }

  if (infinity_symbol_ != DOUBLE_CONVERSION_NULLPTR) {
    if (ConsumeFirstCharacter(*current, infinity_symbol_, allow_case_insensitivity)) {
      if (!ConsumeSubString(&current, end, infinity_symbol_, allow_case_insensitivity)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::Infinity() : Double::Infinity();
    }
  }

  if (nan_symbol_ != DOUBLE_CONVERSION_NULLPTR) {
    if (ConsumeFirstCharacter(*current, nan_symbol_, allow_case_insensitivity)) {
      if (!ConsumeSubString(&current, end, nan_symbol_, allow_case_insensitivity)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::NaN() : Double::NaN();
    }
  }

  bool leading_zero = false;
  if (*current == '0') {
    if (Advance(&current, separator_, 10, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return SignedZero(sign);
    }

    leading_zero = true;

    // It could be hexadecimal value.
    if (((flags_ & ALLOW_HEX) || (flags_ & ALLOW_HEX_FLOATS)) &&
        (*current == 'x' || *current == 'X')) {
      ++current;

      if (current == end) return junk_string_value_;  // "0x"

      bool parse_as_hex_float = (flags_ & ALLOW_HEX_FLOATS) &&
                IsHexFloatString(current, end, separator_, allow_trailing_junk);

      if (!parse_as_hex_float && !isDigit(*current, 16)) {
        return junk_string_value_;
      }

      bool result_is_junk;
      double result = RadixStringToIeee<4>(&current,
                                           end,
                                           sign,
                                           separator_,
                                           parse_as_hex_float,
                                           allow_trailing_junk,
                                           junk_string_value_,
                                           read_as_double,
                                           &result_is_junk);
      if (!result_is_junk) {
        if (allow_trailing_spaces) AdvanceToNonspace(&current, end);
        *processed_characters_count = static_cast<int>(current - input);
      }
      return result;
    }

    // Ignore leading zeros in the integer part.
    while (*current == '0') {
      if (Advance(&current, separator_, 10, end)) {
        *processed_characters_count = static_cast<int>(current - input);
        return SignedZero(sign);
      }
    }
  }

  bool octal = leading_zero && (flags_ & ALLOW_OCTALS) != 0;

  // The longest form of simplified number is: "-<significant digits>.1eXXX\0".
  const int kBufferSize = kMaxSignificantDigits + 10;
  DOUBLE_CONVERSION_STACK_UNINITIALIZED char
      buffer[kBufferSize];  // NOLINT: size is known at compile time.
  int buffer_pos = 0;

  // Copy significant digits of the integer part (if any) to the buffer.
  while (*current >= '0' && *current <= '9') {
    if (significant_digits < kMaxSignificantDigits) {
      DOUBLE_CONVERSION_ASSERT(buffer_pos < kBufferSize);
      buffer[buffer_pos++] = static_cast<char>(*current);
      significant_digits++;
      // Will later check if it's an octal in the buffer.
    } else {
      insignificant_digits++;  // Move the digit into the exponential part.
      nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
    }
    octal = octal && *current < '8';
    if (Advance(&current, separator_, 10, end)) goto parsing_done;
  }

  if (significant_digits == 0) {
    octal = false;
  }

  if (*current == '.') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;

    if (Advance(&current, separator_, 10, end)) {
      if (significant_digits == 0 && !leading_zero) {
        return junk_string_value_;
      } else {
        goto parsing_done;
      }
    }

    if (significant_digits == 0) {
      // octal = false;
      // Integer part consists of 0 or is absent. Significant digits start after
      // leading zeros (if any).
      while (*current == '0') {
        if (Advance(&current, separator_, 10, end)) {
          *processed_characters_count = static_cast<int>(current - input);
          return SignedZero(sign);
        }
        exponent--;  // Move this 0 into the exponent.
      }
    }

    // There is a fractional part.
    // We don't emit a '.', but adjust the exponent instead.
    while (*current >= '0' && *current <= '9') {
      if (significant_digits < kMaxSignificantDigits) {
        DOUBLE_CONVERSION_ASSERT(buffer_pos < kBufferSize);
        buffer[buffer_pos++] = static_cast<char>(*current);
        significant_digits++;
        exponent--;
      } else {
        // Ignore insignificant digits in the fractional part.
        nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
      }
      if (Advance(&current, separator_, 10, end)) goto parsing_done;
    }
  }

  if (!leading_zero && exponent == 0 && significant_digits == 0) {
    // If leading_zeros is true then the string contains zeros.
    // If exponent < 0 then string was [+-]\.0*...
    // If significant_digits != 0 the string is not equal to 0.
    // Otherwise there are no digits in the string.
    return junk_string_value_;
  }

  // Parse exponential part.
  if (*current == 'e' || *current == 'E') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;
    Iterator junk_begin = current;
    ++current;
    if (current == end) {
      if (allow_trailing_junk) {
        current = junk_begin;
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }
    char exponen_sign = '+';
    if (*current == '+' || *current == '-') {
      exponen_sign = static_cast<char>(*current);
      ++current;
      if (current == end) {
        if (allow_trailing_junk) {
          current = junk_begin;
          goto parsing_done;
        } else {
          return junk_string_value_;
        }
      }
    }

    if (current == end || *current < '0' || *current > '9') {
      if (allow_trailing_junk) {
        current = junk_begin;
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }

    const int max_exponent = INT_MAX / 2;
    DOUBLE_CONVERSION_ASSERT(-max_exponent / 2 <= exponent && exponent <= max_exponent / 2);
    int num = 0;
    do {
      // Check overflow.
      int digit = *current - '0';
      if (num >= max_exponent / 10
          && !(num == max_exponent / 10 && digit <= max_exponent % 10)) {
        num = max_exponent;
      } else {
        num = num * 10 + digit;
      }
      ++current;
    } while (current != end && *current >= '0' && *current <= '9');

    exponent += (exponen_sign == '-' ? -num : num);
  }

  if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
    return junk_string_value_;
  }
  if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
    return junk_string_value_;
  }
  if (allow_trailing_spaces) {
    AdvanceToNonspace(&current, end);
  }

  parsing_done:
  exponent += insignificant_digits;

  if (octal) {
    double result;
    bool result_is_junk;
    char* start = buffer;
    result = RadixStringToIeee<3>(&start,
                                  buffer + buffer_pos,
                                  sign,
                                  separator_,
                                  false, // Don't parse as hex_float.
                                  allow_trailing_junk,
                                  junk_string_value_,
                                  read_as_double,
                                  &result_is_junk);
    DOUBLE_CONVERSION_ASSERT(!result_is_junk);
    *processed_characters_count = static_cast<int>(current - input);
    return result;
  }

  if (nonzero_digit_dropped) {
    buffer[buffer_pos++] = '1';
    exponent--;
  }

  DOUBLE_CONVERSION_ASSERT(buffer_pos < kBufferSize);
  buffer[buffer_pos] = '\0';

  // Code above ensures there are no leading zeros and the buffer has fewer than
  // kMaxSignificantDecimalDigits characters. Trim trailing zeros.
  Vector<const char> chars(buffer, buffer_pos);
  chars = TrimTrailingZeros(chars);
  exponent += buffer_pos - chars.length();

  double converted;
  if (read_as_double) {
    converted = StrtodTrimmed(chars, exponent);
  } else {
    converted = StrtofTrimmed(chars, exponent);
  }
  *processed_characters_count = static_cast<int>(current - input);
  return sign? -converted: converted;
}